

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_inline.cpp
# Opt level: O1

BBLIter __thiscall
mocker::FunctionInline::inlineFunction
          (FunctionInline *this,FunctionModule *caller,BBLIter bbIter,InstListIter callInstIter)

{
  _List_node_base **this_00;
  int iVar1;
  _func_int *p_Var2;
  Branch *__nptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  mapped_type mVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _List_node_base **pp_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer psVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  bool bVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  iterator iVar11;
  BBLIter BVar12;
  _List_node_base *p_Var13;
  mapped_type *pmVar14;
  _func_int **pp_Var15;
  mapped_type *pmVar16;
  int *piVar17;
  ulong uVar18;
  iterator iVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_6;
  _List_node_base *p_Var20;
  _Atomic_word *this_02;
  _List_node_base *p_Var21;
  FunctionInline *this_03;
  size_t in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  shared_ptr<mocker::ir::Reg> newDest;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  newLabelID;
  shared_ptr<mocker::ir::Reg> retVal;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newIdent;
  mapped_type callee;
  uint in_stack_fffffffffffffd88;
  _Alloc_hider _Var24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  undefined1 local_268 [23];
  undefined1 local_251;
  FunctionModule *local_250;
  pointer local_248;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_240;
  _List_node_base *local_228;
  undefined1 local_220 [24];
  size_type sStack_208;
  float local_200;
  size_type local_1f8;
  undefined1 auStack_1f0 [8];
  shared_ptr<mocker::ir::Reg> local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  shared_ptr<mocker::ir::Label> local_1c8;
  _List_node_base *local_1b8;
  _List_node_base **local_1b0;
  shared_ptr<mocker::ir::IRInst> local_1a8;
  undefined1 local_198 [32];
  float local_178;
  pointer local_170;
  _List_node_base _Stack_168;
  _List_node_base *local_158;
  _List_node_base *local_150;
  shared_ptr<mocker::ir::IRInst> local_148;
  _List_node_base *local_138;
  _List_node_base *local_130;
  shared_ptr<mocker::ir::IRInst> local_128;
  shared_ptr<mocker::ir::IRInst> local_118;
  FunctionModule local_108;
  
  p_Var20 = callInstIter._M_node[1]._M_next;
  if (*(int *)&p_Var20->_M_prev == 0xe) {
    local_248 = (pointer)callInstIter._M_node[1]._M_prev;
    if (local_248 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_248->_M_string_length = *(int *)&local_248->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_248->_M_string_length = *(int *)&local_248->_M_string_length + 1;
      }
    }
  }
  else {
    local_248 = (pointer)0x0;
    p_Var20 = (_List_node_base *)0x0;
  }
  local_250 = caller;
  iVar11 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(((this->super_ModulePass).module)->funcs)._M_h,(key_type *)&p_Var20[2]._M_prev);
  if (iVar11.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  ir::FunctionModule::FunctionModule
            (&local_108,
             (FunctionModule *)
             ((long)iVar11.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                    ._M_cur + 0x28));
  if (local_108.isExternal == true) {
    p_Var20 = (bbIter._M_node)->_M_next;
  }
  else {
    local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var20[1]._M_prev != (_List_node_base *)0x0) {
      local_220._0_8_ = (Load *)(local_220 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"retVal","");
      ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_198,&local_250->identifier);
      uVar6 = local_198._8_8_;
      local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._0_8_;
      _Var3._M_pi = local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_198._0_8_ = (_List_node_base *)0x0;
      local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      if ((Load *)local_220._0_8_ != (Load *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_,
                        (ulong)((long)(_Hash_node_base **)local_220._16_8_ + 1));
      }
      p_Var13 = (local_250->bbs).
                super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      local_220._0_8_ = (Load *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),(Alloca **)local_220,
                 (allocator<mocker::ir::Alloca> *)local_198,&local_1e8);
      local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_220._0_8_;
      local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_;
      local_220._0_8_ = (Load *)0x0;
      local_220._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ir::BasicBlock::appendInstFront((BasicBlock *)(p_Var13 + 1),&local_118);
      if (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
      }
    }
    BVar12 = ir::FunctionModule::insertBBAfter(local_250,bbIter);
    pp_Var5 = &p_Var20[1]._M_prev;
    this_00 = &BVar12._M_node[1]._M_prev;
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::splice((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
              *)this_00,(int)this_00,(__off64_t *)&bbIter._M_node[1]._M_prev,
             (int)callInstIter._M_node,(__off64_t *)&bbIter._M_node[1]._M_prev,in_R9,
             in_stack_fffffffffffffd88);
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::_M_erase((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                *)this_00,BVar12._M_node[1]._M_prev);
    local_1b0 = pp_Var5;
    if (*pp_Var5 != (_List_node_base *)0x0) {
      local_220._0_8_ = (Load *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Reg>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8),(Load **)local_220,
                 (allocator<mocker::ir::Load> *)local_198,(shared_ptr<mocker::ir::Reg> *)pp_Var5,
                 &local_1e8);
      p_Var13 = (_List_node_base *)operator_new(0x20);
      uVar6 = local_220._8_8_;
      p_Var13[1]._M_next = (_List_node_base *)local_220._0_8_;
      p_Var13[1]._M_prev = (_List_node_base *)0x0;
      local_220._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var13[1]._M_prev = (_List_node_base *)uVar6;
      local_220._0_8_ = (Load *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var13);
      BVar12._M_node[2]._M_prev =
           (_List_node_base *)((long)&(BVar12._M_node[2]._M_prev)->_M_next + 1);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
      }
    }
    local_220._0_8_ = auStack_1f0;
    local_220._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_220._16_8_ = (_Hash_node_base *)0x0;
    sStack_208 = 0;
    local_200 = 1.0;
    local_1f8 = 0;
    auStack_1f0 = (undefined1  [8])0x0;
    p_Var13 = (_List_node_base *)&local_108.bbs;
    local_228 = BVar12._M_node;
    local_150 = p_Var20;
    if (p_Var13 !=
        local_108.bbs.
        super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
        _M_node.super__List_node_base._M_next) {
      do {
        p_Var20 = p_Var13->_M_prev;
        BVar12 = ir::FunctionModule::insertBBAfter(local_250,bbIter);
        if (BVar12._M_node != p_Var20) {
          std::__cxx11::
          list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
          ::_M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>>>
                    ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                      *)&BVar12._M_node[1]._M_prev,p_Var20[1]._M_prev,&p_Var20[1]._M_prev);
        }
        p_Var21 = BVar12._M_node[1]._M_next;
        local_198._0_8_ = p_Var20[1]._M_next;
        pmVar14 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_220,(key_type *)local_198);
        *pmVar14 = (mapped_type)p_Var21;
        p_Var13 = p_Var13->_M_prev;
      } while (p_Var13 !=
               local_108.bbs.
               super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
               _M_impl._M_node.super__List_node_base._M_next);
    }
    local_198._0_8_ =
         local_108.bbs.
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next[1]._M_next;
    pmVar14 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)local_220,(key_type *)local_198);
    pp_Var15 = (_func_int **)operator_new(0x20);
    pp_Var15[1] = (_func_int *)0x100000001;
    *pp_Var15 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001efa00;
    p_Var2 = (_func_int *)*pmVar14;
    pp_Var15[2] = (_func_int *)&PTR__Addr_001efab0;
    pp_Var15[3] = p_Var2;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var20 = local_228;
    (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efc20;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = 0xc;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc70;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc90;
    *(_func_int ***)
     &local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      [2]._M_use_count = pp_Var15 + 2;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [3]._vptr__Sp_counted_base = pp_Var15;
    ir::BasicBlock::appendInst((BasicBlock *)(bbIter._M_node + 1),&local_128);
    if (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_198._0_8_ = &_Stack_168;
    local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_198._16_8_ = 0;
    local_198._24_8_ = 0;
    local_178 = 1.0;
    local_170 = (pointer)0x0;
    _Stack_168._M_next = (_List_node_base *)0x0;
    p_Var13 = (bbIter._M_node)->_M_next;
    local_1b8 = p_Var13;
    if (p_Var13 != p_Var20) {
      do {
        local_158 = (_List_node_base *)&p_Var13[1]._M_prev;
        p_Var20 = p_Var13[1]._M_prev;
        _Stack_168._M_prev = p_Var13;
        if (p_Var20 != local_158) {
          do {
            p_Var13 = p_Var20[1]._M_next;
            if (*(int *)&p_Var13->_M_prev == 0xf) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                }
              }
            }
            else {
              p_Var13 = (_List_node_base *)0x0;
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (p_Var13 != (_List_node_base *)0x0) {
              __assert_fail("!ir::dyc<ir::Phi>(inst)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/function_inline.cpp"
                            ,0xa0,
                            "ir::BBLIter mocker::FunctionInline::inlineFunction(ir::FunctionModule &, ir::BBLIter, ir::InstListIter)"
                           );
            }
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var20 + 1);
            ir::getDest((ir *)local_268,(shared_ptr<mocker::ir::IRInst> *)p_Var22);
            _Var24._M_p = (pointer)local_268._0_8_;
            _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
            local_268._0_8_ = (Branch *)0x0;
            local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ir::dycLocalReg((ir *)&local_240,
                            (shared_ptr<mocker::ir::Addr> *)&stack0xfffffffffffffd88);
            if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_240.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ir::FunctionModule::makeTempLocalReg
                        ((FunctionModule *)&stack0xfffffffffffffd88,&local_250->identifier);
              ir::copyWithReplacedDest
                        ((ir *)local_268,(shared_ptr<mocker::ir::IRInst> *)p_Var22,
                         (shared_ptr<mocker::ir::Reg> *)&stack0xfffffffffffffd88);
              uVar7 = local_268._8_8_;
              uVar6 = local_268._0_8_;
              local_268._0_8_ = (Branch *)0x0;
              local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              p_Var20[1]._M_next = (_List_node_base *)uVar6;
              p_Var20[1]._M_prev = (_List_node_base *)uVar7;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
              }
              pmVar16 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_198,
                                     (key_type *)
                                     ((long)local_240.
                                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 8));
              std::__cxx11::string::_M_assign((string *)pmVar16);
              if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_240.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_240.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            ir::getOperandsUsed(&local_240,(shared_ptr<mocker::ir::IRInst> *)p_Var22);
            psVar8 = local_240.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_1d0._M_pi = p_Var22;
            if (local_240.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_240.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              this_02 = (_Atomic_word *)
                        ((long)local_240.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8);
              do {
                this_03 = (FunctionInline *)&stack0xfffffffffffffd88;
                ir::dycLocalReg((ir *)&stack0xfffffffffffffd88,
                                (shared_ptr<mocker::ir::Addr> *)(this_02 + -2));
                if ((Branch *)_Var24._M_p != (Branch *)0x0) {
                  bVar10 = isParameter(this_03,&local_108,(string *)(_Var24._M_p + 8));
                  if (bVar10) {
                    __nptr = *(Branch **)(_Var24._M_p + 8);
                    piVar17 = __errno_location();
                    iVar1 = *piVar17;
                    *piVar17 = 0;
                    uVar18 = strtol((char *)__nptr,(char **)local_268,10);
                    if ((Branch *)local_268._0_8_ != __nptr) {
                      if (*piVar17 == 0) {
                        *piVar17 = iVar1;
                      }
                      else if (*piVar17 == 0x22) {
                        std::__throw_out_of_range("stol");
                      }
                      if (uVar18 < (ulong)((long)local_150[5]._M_next - (long)local_150[4]._M_prev
                                          >> 4)) {
                        p_Var13 = local_150[4]._M_prev + uVar18;
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_02 + -2))->
                        _vptr__Sp_counted_base = (_func_int **)p_Var13->_M_next;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_02,
                                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var13->_M_prev);
                        goto LAB_00162760;
                      }
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar18);
                    }
                    std::__throw_invalid_argument("stol");
LAB_00162ea5:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  iVar19 = std::
                           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   *)local_198,(key_type *)(_Var24._M_p + 8));
                  if (iVar19.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur == (__node_type *)0x0) goto LAB_00162ea5;
                  local_268._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,std::__cxx11::string&>
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8),
                             (Reg **)local_268,(allocator<mocker::ir::Reg> *)&local_1c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)iVar19.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    ._M_cur + 0x28));
                  uVar7 = local_268._8_8_;
                  uVar6 = local_268._0_8_;
                  local_268._0_8_ = (Branch *)0x0;
                  local_268._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this_02;
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_02 + -2))->
                  _vptr__Sp_counted_base = (_func_int **)uVar6;
                  *(undefined8 *)this_02 = uVar7;
                  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                  }
                }
LAB_00162760:
                if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                }
                p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this_02 + 2);
                this_02 = this_02 + 4;
              } while (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar8);
            }
            _Var9._M_pi = local_1d0._M_pi;
            ir::copyWithReplacedOperands
                      ((ir *)&stack0xfffffffffffffd88,
                       (shared_ptr<mocker::ir::IRInst> *)local_1d0._M_pi,&local_240);
            _Var3._M_pi = _Stack_270._M_pi;
            _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
            p_Var20[1]._M_next = (_List_node_base *)_Var24._M_p;
            p_Var20[1]._M_prev = (_List_node_base *)_Var3._M_pi;
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
            }
            p_Var13 = (_List_node_base *)(_Var9._M_pi)->_vptr__Sp_counted_base;
            if (*(int *)&p_Var13->_M_prev == 0xb) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                }
              }
            }
            else {
              p_Var13 = (_List_node_base *)0x0;
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (p_Var13 == (_List_node_base *)0x0) {
              p_Var13 = (_List_node_base *)(local_1d0._M_pi)->_vptr__Sp_counted_base;
              if (*(int *)&p_Var13->_M_prev == 0xc) {
                p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
                if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                  }
                }
              }
              else {
                p_Var13 = (_List_node_base *)0x0;
                p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              if (p_Var13 != (_List_node_base *)0x0) {
                pmVar14 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_220,(key_type *)&stack0xfffffffffffffd88);
                p_Var21 = (_List_node_base *)operator_new(0x20);
                p_Var21->_M_prev = (_List_node_base *)0x100000001;
                p_Var21->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efa00;
                p_Var13 = (_List_node_base *)*pmVar14;
                p_Var21[1]._M_next = (_List_node_base *)&PTR__Addr_001efab0;
                p_Var21[1]._M_prev = p_Var13;
                p_Var13 = (_List_node_base *)operator_new(0x38);
                p_Var13->_M_prev = (_List_node_base *)0x100000001;
                p_Var13->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efc20;
                *(undefined4 *)&p_Var13[1]._M_prev = 0xc;
                p_Var13[1]._M_next = (_List_node_base *)&PTR__Jump_001efc70;
                p_Var13[2]._M_next = (_List_node_base *)&PTR__Jump_001efc90;
                p_Var13[2]._M_prev = p_Var21 + 1;
                p_Var13[3]._M_next = p_Var21;
                p_Var20[1]._M_next = p_Var13 + 1;
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
                p_Var20[1]._M_prev = p_Var13;
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                }
              }
            }
            else {
              local_130 = (p_Var13[2]._M_prev)->_M_prev;
              pmVar14 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_220,(key_type *)&local_130);
              local_268._0_8_ = 0;
              local_268._8_8_ = operator_new(0x20);
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_)->_M_use_count = 1;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_)->_M_weak_count = 1;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_)->
              _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
              local_268._0_8_ = local_268._8_8_ + 0x10;
              mVar4 = *pmVar14;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268._8_8_ + 0x10))->
              _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268._8_8_ + 0x10))->
              _M_use_count = (int)mVar4;
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268._8_8_ + 0x10))->
              _M_weak_count = (int)(mVar4 >> 0x20);
              local_138 = (p_Var13[3]._M_prev)->_M_prev;
              pmVar14 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_220,(key_type *)&local_138);
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20)
              ;
              (local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count = 1;
              (local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count = 1;
              (local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_001efa00;
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1);
              mVar4 = *pmVar14;
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001efab0;
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_use_count = (int)mVar4;
              local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_weak_count = (int)(mVar4 >> 0x20);
              _Var24._M_p = (pointer)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
                        (&_Stack_270,(Branch **)&stack0xfffffffffffffd88,
                         (allocator<mocker::ir::Branch> *)&local_251,
                         (shared_ptr<mocker::ir::Addr> *)&p_Var13[1]._M_prev,
                         (shared_ptr<mocker::ir::Label> *)local_268,&local_1c8);
              _Var3._M_pi = _Stack_270._M_pi;
              _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              p_Var20[1]._M_next = (_List_node_base *)_Var24._M_p;
              p_Var20[1]._M_prev = (_List_node_base *)_Var3._M_pi;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
              if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
              }
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
              if (local_1c8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c8.
                           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
              }
            }
            if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
            }
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            p_Var13 = (_List_node_base *)(local_1d0._M_pi)->_vptr__Sp_counted_base;
            if (*(int *)&p_Var13->_M_prev == 9) {
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                }
              }
            }
            else {
              p_Var13 = (_List_node_base *)0x0;
              p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (p_Var13 != (_List_node_base *)0x0) {
              p_Var13 = (local_250->bbs).
                        super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
              std::__cxx11::
              list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::_M_insert<std::shared_ptr<mocker::ir::IRInst>>
                        ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                          *)&p_Var13[1]._M_prev,p_Var13[1]._M_prev,
                         (shared_ptr<mocker::ir::IRInst> *)local_1d0._M_pi);
              p_Var13 = (_List_node_base *)operator_new(0x20);
              p_Var13->_M_prev = (_List_node_base *)0x100000001;
              p_Var13->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efd18;
              *(undefined4 *)&p_Var13[1]._M_prev = 0;
              p_Var13[1]._M_next = (_List_node_base *)&PTR__IRInst_001efd68;
              p_Var20[1]._M_next = p_Var13 + 1;
              p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var20[1]._M_prev;
              p_Var20[1]._M_prev = p_Var13;
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
            }
            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
            }
            std::
            vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ::~vector(&local_240);
            p_Var20 = p_Var20->_M_next;
          } while (p_Var20 != local_158);
        }
        p_Var13 = (_Stack_168._M_prev)->_M_next;
        p_Var20 = local_228;
      } while (p_Var13 != local_228);
    }
    p_Var13 = local_1b8;
    if (local_1b8 != p_Var20) {
      do {
        p_Var21 = p_Var13[2]._M_next[1]._M_next;
        if (*(int *)&p_Var21->_M_prev == 0xd) {
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var13[2]._M_next[1]._M_prev;
          if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var21 = (_List_node_base *)0x0;
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var21 != (_List_node_base *)0x0) {
          std::__cxx11::
          list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ::_M_erase((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                      *)&p_Var13[1]._M_prev,p_Var13[2]._M_next);
          if (*local_1b0 != (_List_node_base *)0x0) {
            if (p_Var21[1]._M_prev == (_List_node_base *)0x0) {
              _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
              *(_List_node_base **)&(_Stack_270._M_pi)->_M_use_count =
                   (_List_node_base *)0x100000001;
              (_Stack_270._M_pi)->_vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
              _Stack_270._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
              *(_List_node_base **)&_Stack_270._M_pi[1]._M_use_count = (_List_node_base *)0x0;
            }
            else {
              _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var21[2]._M_next;
              if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (_Stack_270._M_pi)->_M_use_count = (_Stack_270._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (_Stack_270._M_pi)->_M_use_count = (_Stack_270._M_pi)->_M_use_count + 1;
                }
              }
            }
            local_240.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>const>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_240.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(Store **)&local_240,
                       (allocator<mocker::ir::Store> *)local_268,&local_1e8,
                       (shared_ptr<mocker::ir::Addr> *)&stack0xfffffffffffffd88);
            local_148.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_240.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_148.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_240.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_240.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_240.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ir::BasicBlock::appendInst((BasicBlock *)(p_Var13 + 1),&local_148);
            if (local_148.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_148.
                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_240.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_240.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
            }
          }
          p_Var20 = local_228[1]._M_next;
          pp_Var15 = (_func_int **)operator_new(0x20);
          pp_Var15[1] = (_func_int *)0x100000001;
          *pp_Var15 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001efa00;
          pp_Var15[2] = (_func_int *)&PTR__Addr_001efab0;
          pp_Var15[3] = (_func_int *)p_Var20;
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count = 1;
          (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_weak_count = 1;
          (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001efc20;
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 1);
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._M_use_count = 0xc;
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc70;
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001efc90;
          *(_func_int ***)
           &local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi[2]._M_use_count = pp_Var15 + 2;
          local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._vptr__Sp_counted_base = pp_Var15;
          ir::BasicBlock::appendInst((BasicBlock *)(p_Var13 + 1),&local_1a8);
          p_Var20 = local_228;
          if (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
        }
        pp_Var5 = &p_Var13->_M_next;
        p_Var13 = *pp_Var5;
      } while (*pp_Var5 != p_Var20);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_198);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_220);
    if (local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.predecessors._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.bbMap._M_h);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_108.bbs.
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.identifier._M_dataplus._M_p != &local_108.identifier.field_2) {
    operator_delete(local_108.identifier._M_dataplus._M_p,
                    local_108.identifier.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248);
  }
  return (BBLIter)p_Var20;
}

Assistant:

ir::BBLIter FunctionInline::inlineFunction(ir::FunctionModule &caller,
                                           ir::BBLIter bbIter,
                                           ir::InstListIter callInstIter) {
  auto call = ir::dyc<ir::Call>(*callInstIter);
  // do not use a reference here
  auto callee = module.getFuncs().at(call->getFuncName());
  if (callee.isExternalFunc())
    return ++bbIter;

  // create a temporary variable to hold the return value
  std::shared_ptr<ir::Reg> retVal = nullptr;
  if (call->getDest()) {
    retVal = caller.makeTempLocalReg("retVal");
    caller.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(retVal));
  }

  // move the subsequent instructions to a new BB
  auto succBBIter = caller.insertBBAfter(bbIter);
  succBBIter->getMutableInsts().splice(succBBIter->getMutableInsts().end(),
                                       bbIter->getMutableInsts(), callInstIter,
                                       bbIter->getMutableInsts().end());
  succBBIter->getMutableInsts().pop_front();
  if (call->getDest())
    succBBIter->getMutableInsts().emplace_front(
        std::make_shared<ir::Load>(call->getDest(), retVal));

  // insert new BBs
  std::unordered_map<std::size_t, std::size_t> newLabelID;
  for (auto riter = callee.getBBs().rbegin(); riter != callee.getBBs().rend();
       ++riter) {
    const auto &bb = *riter;
    auto &curBB = *caller.insertBBAfter(bbIter);
    curBB.getMutableInsts() = bb.getInsts();
    newLabelID[bb.getLabelID()] = curBB.getLabelID();
  }
  bbIter->appendInst(std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
      newLabelID.at(callee.getFirstBB()->getLabelID()))));

  // rename identifiers & LabelID; move alloca's to the first block
  std::unordered_map<std::string, std::string> newIdent;
  auto insertedBeg = bbIter;
  ++insertedBeg;
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    for (auto &inst : bb.getMutableInsts()) {
      assert(!ir::dyc<ir::Phi>(inst));
      if (auto dest = ir::dycLocalReg(ir::getDest(inst))) {
        auto newDest = caller.makeTempLocalReg(dest->getIdentifier());
        inst = ir::copyWithReplacedDest(inst, newDest);
        newIdent[dest->getIdentifier()] = newDest->getIdentifier();
      }

      auto operands = ir::getOperandsUsed(inst);
      for (auto &operand : operands) {
        auto reg = ir::dycLocalReg(operand);
        if (!reg)
          continue;
        if (isParameter(callee, reg->getIdentifier())) {
          auto n = std::stol(reg->getIdentifier(), nullptr);
          operand = call->getArgs().at((std::size_t)n);
          continue;
        }
        operand = std::make_shared<ir::Reg>(newIdent.at(reg->getIdentifier()));
      }
      inst = ir::copyWithReplacedOperands(inst, operands);

      if (auto br = ir::dyc<ir::Branch>(inst)) {
        inst = std::make_shared<ir::Branch>(
            br->getCondition(),
            std::make_shared<ir::Label>(newLabelID.at(br->getThen()->getID())),
            std::make_shared<ir::Label>(newLabelID.at(br->getElse()->getID())));
      } else if (auto jump = ir::dyc<ir::Jump>(inst)) {
        inst = std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
            newLabelID.at(jump->getLabel()->getID())));
      }

      if (auto alloca = ir::dyc<ir::Alloca>(inst)) {
        caller.getFirstBB()->getMutableInsts().push_front(std::move(inst));
        inst = std::make_shared<ir::Deleted>();
      }
    }
  }

  // rewrite Ret's
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    auto ret = ir::dyc<ir::Ret>(bb.getMutableInsts().back());
    if (!ret)
      continue;
    bb.getMutableInsts().pop_back();
    if (call->getDest()) {
      bb.appendInst(std::make_shared<ir::Store>(
          retVal,
          ret->getVal() ? ret->getVal() : std::make_shared<ir::IntLiteral>(0)));
    }
    bb.appendInst(std::make_shared<ir::Jump>(
        std::make_shared<ir::Label>(succBBIter->getLabelID())));
  }

  return succBBIter;
}